

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O2

unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
 __thiscall ApplicationFactory::makeRenderer(ApplicationFactory *this,Context *context)

{
  unique_ptr<solitaire::graphics::SDLGraphicsSystem,_std::default_delete<solitaire::graphics::SDLGraphicsSystem>_>
  *in_RDX;
  ApplicationFactory *this_00;
  undefined1 local_50 [8];
  long *local_48;
  undefined1 local_40 [8];
  string local_38;
  
  this_00 = (ApplicationFactory *)&local_48;
  std::make_unique<solitaire::SDL::Wrapper>();
  std::
  make_unique<solitaire::graphics::SDLGraphicsSystem,std::unique_ptr<solitaire::SDL::Wrapper,std::default_delete<solitaire::SDL::Wrapper>>>
            ((unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> *)
             local_50);
  findAssetsPath_abi_cxx11_((string *)(local_40 + 8),this_00);
  std::
  make_unique<solitaire::graphics::Renderer,solitaire::interfaces::Context_const&,std::unique_ptr<solitaire::graphics::SDLGraphicsSystem,std::default_delete<solitaire::graphics::SDLGraphicsSystem>>,std::__cxx11::string>
            ((Context *)local_40,in_RDX,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  *(undefined1 (*) [8])this = local_40;
  local_40 = (undefined1  [8])0x0;
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (local_50 != (undefined1  [8])0x0) {
    (*((Wrapper *)local_50)->_vptr_Wrapper[1])();
  }
  local_50 = (undefined1  [8])0x0;
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  return (__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
          )(__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<graphics::interfaces::Renderer>
ApplicationFactory::makeRenderer(
    const solitaire::interfaces::Context& context) const
{
    return std::make_unique<Renderer>(
        context,
        std::make_unique<SDLGraphicsSystem>(
            std::make_unique<SDL::Wrapper>()
        ),
        findAssetsPath()
    );
}